

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopTruth.c
# Opt level: O1

word Hop_ManComputeTruth6_rec(Hop_Man_t *p,Hop_Obj_t *pObj)

{
  word wVar1;
  word wVar2;
  
  if ((*(uint *)&pObj->field_0x20 & 7) == 2) {
    wVar1 = Truth[(pObj->field_0).iData];
  }
  else {
    if ((*(uint *)&pObj->field_0x20 & 6) != 4) {
      __assert_fail("Hop_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopTruth.c"
                    ,0xf9,"word Hop_ManComputeTruth6_rec(Hop_Man_t *, Hop_Obj_t *)");
    }
    wVar1 = Hop_ManComputeTruth6_rec(p,(Hop_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    wVar2 = Hop_ManComputeTruth6_rec(p,(Hop_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
    wVar1 = (-(ulong)((uint)pObj->pFanin1 & 1) ^ wVar2) &
            (-(ulong)((uint)pObj->pFanin0 & 1) ^ wVar1);
  }
  return wVar1;
}

Assistant:

word Hop_ManComputeTruth6_rec( Hop_Man_t * p, Hop_Obj_t * pObj )
{
    word Truth0, Truth1;
    if ( Hop_ObjIsPi(pObj) )
        return Truth[pObj->iData];
    assert( Hop_ObjIsNode(pObj) );
    Truth0 = Hop_ManComputeTruth6_rec( p, Hop_ObjFanin0(pObj) );
    Truth1 = Hop_ManComputeTruth6_rec( p, Hop_ObjFanin1(pObj) );
    Truth0 = Hop_ObjFaninC0(pObj) ? ~Truth0 : Truth0;
    Truth1 = Hop_ObjFaninC1(pObj) ? ~Truth1 : Truth1;
    return Truth0 & Truth1;
}